

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  int iVar21;
  undefined4 uVar22;
  ulong unaff_RBX;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  undefined1 auVar30 [64];
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar12 = fVar4 * 0.99999964;
  fVar13 = fVar5 * 0.99999964;
  fVar14 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar21 = (tray->tnear).field_0.i[k];
  auVar49._4_4_ = iVar21;
  auVar49._0_4_ = iVar21;
  auVar49._8_4_ = iVar21;
  auVar49._12_4_ = iVar21;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar30 = ZEXT1664(CONCAT412(iVar21,CONCAT48(iVar21,CONCAT44(iVar21,iVar21))));
  do {
    do {
      if (pSVar29 == stack) {
        return;
      }
      pSVar20 = pSVar29 + -1;
      pSVar29 = pSVar29 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < (float)pSVar20->dist);
    sVar26 = (pSVar29->ptr).ptr;
    do {
      if ((sVar26 & 0xf) == 0) {
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar27),auVar56);
        auVar31._0_4_ = fVar12 * auVar34._0_4_;
        auVar31._4_4_ = fVar12 * auVar34._4_4_;
        auVar31._8_4_ = fVar12 * auVar34._8_4_;
        auVar31._12_4_ = fVar12 * auVar34._12_4_;
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar28),auVar57);
        auVar36._0_4_ = fVar13 * auVar34._0_4_;
        auVar36._4_4_ = fVar13 * auVar34._4_4_;
        auVar36._8_4_ = fVar13 * auVar34._8_4_;
        auVar36._12_4_ = fVar13 * auVar34._12_4_;
        auVar34 = vmaxps_avx(auVar31,auVar36);
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar23),auVar52);
        auVar37._0_4_ = fVar14 * auVar31._0_4_;
        auVar37._4_4_ = fVar14 * auVar31._4_4_;
        auVar37._8_4_ = fVar14 * auVar31._8_4_;
        auVar37._12_4_ = fVar14 * auVar31._12_4_;
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + (uVar27 ^ 0x10)),auVar56);
        auVar40._0_4_ = fVar4 * auVar31._0_4_;
        auVar40._4_4_ = fVar4 * auVar31._4_4_;
        auVar40._8_4_ = fVar4 * auVar31._8_4_;
        auVar40._12_4_ = fVar4 * auVar31._12_4_;
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + (uVar28 ^ 0x10)),auVar57);
        auVar43._0_4_ = fVar5 * auVar31._0_4_;
        auVar43._4_4_ = fVar5 * auVar31._4_4_;
        auVar43._8_4_ = fVar5 * auVar31._8_4_;
        auVar43._12_4_ = fVar5 * auVar31._12_4_;
        auVar33 = vminps_avx(auVar40,auVar43);
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + (uVar23 ^ 0x10)),auVar52);
        auVar44._0_4_ = fVar6 * auVar31._0_4_;
        auVar44._4_4_ = fVar6 * auVar31._4_4_;
        auVar44._8_4_ = fVar6 * auVar31._8_4_;
        auVar44._12_4_ = fVar6 * auVar31._12_4_;
        auVar31 = vmaxps_avx(auVar37,auVar49);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar34,auVar31);
        auVar34 = vminps_avx(auVar44,auVar30._0_16_);
        auVar34 = vminps_avx(auVar33,auVar34);
        auVar34 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar34,2);
        uVar22 = vmovmskps_avx(auVar34);
LAB_00603993:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar22);
        bVar19 = true;
      }
      else {
        if ((int)(sVar26 & 0xf) == 2) {
          uVar24 = sVar26 & 0xfffffffffffffff0;
          auVar34 = *(undefined1 (*) [16])(uVar24 + 0x80);
          auVar51._0_4_ = fVar3 * auVar34._0_4_;
          auVar51._4_4_ = fVar3 * auVar34._4_4_;
          auVar51._8_4_ = fVar3 * auVar34._8_4_;
          auVar51._12_4_ = fVar3 * auVar34._12_4_;
          auVar31 = *(undefined1 (*) [16])(uVar24 + 0x90);
          auVar53._0_4_ = fVar3 * auVar31._0_4_;
          auVar53._4_4_ = fVar3 * auVar31._4_4_;
          auVar53._8_4_ = fVar3 * auVar31._8_4_;
          auVar53._12_4_ = fVar3 * auVar31._12_4_;
          auVar54._0_4_ = fVar3 * *(float *)*(undefined1 (*) [16])(uVar24 + 0xa0);
          auVar54._4_4_ = fVar3 * *(float *)(uVar24 + 0xa4);
          auVar54._8_4_ = fVar3 * *(float *)(uVar24 + 0xa8);
          auVar54._12_4_ = fVar3 * *(float *)(uVar24 + 0xac);
          auVar17._4_4_ = uVar2;
          auVar17._0_4_ = uVar2;
          auVar17._8_4_ = uVar2;
          auVar17._12_4_ = uVar2;
          auVar33 = vfmadd231ps_fma(auVar51,auVar17,*(undefined1 (*) [16])(uVar24 + 0x50));
          auVar45 = vfmadd231ps_fma(auVar53,auVar17,*(undefined1 (*) [16])(uVar24 + 0x60));
          auVar18._4_4_ = uVar1;
          auVar18._0_4_ = uVar1;
          auVar18._8_4_ = uVar1;
          auVar18._12_4_ = uVar1;
          auVar51 = vfmadd231ps_fma(auVar33,auVar18,*(undefined1 (*) [16])(uVar24 + 0x20));
          auVar47 = vfmadd231ps_fma(auVar45,auVar18,*(undefined1 (*) [16])(uVar24 + 0x30));
          auVar55._8_4_ = 0x7fffffff;
          auVar55._0_8_ = 0x7fffffff7fffffff;
          auVar55._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx(auVar55,auVar51);
          auVar46._8_4_ = 0x219392ef;
          auVar46._0_8_ = 0x219392ef219392ef;
          auVar46._12_4_ = 0x219392ef;
          auVar33 = vcmpps_avx(auVar33,auVar46,1);
          auVar45 = vblendvps_avx(auVar51,auVar46,auVar33);
          auVar33 = vandps_avx(auVar47,auVar55);
          auVar33 = vcmpps_avx(auVar33,auVar46,1);
          auVar51 = vblendvps_avx(auVar47,auVar46,auVar33);
          auVar33 = vfmadd231ps_fma(auVar54,auVar17,*(undefined1 (*) [16])(uVar24 + 0x70));
          auVar47 = vfmadd231ps_fma(auVar33,auVar18,*(undefined1 (*) [16])(uVar24 + 0x40));
          auVar33 = vandps_avx(auVar47,auVar55);
          auVar33 = vcmpps_avx(auVar33,auVar46,1);
          auVar33 = vblendvps_avx(auVar47,auVar46,auVar33);
          auVar47 = vrcpps_avx(auVar45);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar45 = vfnmadd213ps_fma(auVar45,auVar47,auVar32);
          auVar47 = vfmadd132ps_fma(auVar45,auVar47,auVar47);
          auVar45 = vrcpps_avx(auVar51);
          auVar51 = vfnmadd213ps_fma(auVar51,auVar45,auVar32);
          auVar51 = vfmadd132ps_fma(auVar51,auVar45,auVar45);
          auVar45 = vrcpps_avx(auVar33);
          auVar17 = vfnmadd213ps_fma(auVar33,auVar45,auVar32);
          auVar33 = vfmadd213ps_fma(auVar34,auVar52,*(undefined1 (*) [16])(uVar24 + 0xb0));
          auVar34 = vfmadd132ps_fma(auVar17,auVar45,auVar45);
          auVar33 = vfmadd231ps_fma(auVar33,auVar57,*(undefined1 (*) [16])(uVar24 + 0x50));
          auVar31 = vfmadd213ps_fma(auVar31,auVar52,*(undefined1 (*) [16])(uVar24 + 0xc0));
          auVar45 = vfmadd231ps_fma(auVar31,auVar57,*(undefined1 (*) [16])(uVar24 + 0x60));
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0xa0),auVar52,
                                    *(undefined1 (*) [16])(uVar24 + 0xd0));
          auVar31 = vfmadd231ps_fma(auVar31,auVar57,*(undefined1 (*) [16])(uVar24 + 0x70));
          auVar33 = vfmadd231ps_fma(auVar33,auVar56,*(undefined1 (*) [16])(uVar24 + 0x20));
          auVar41._0_4_ = auVar33._0_4_ * -auVar47._0_4_;
          auVar41._4_4_ = auVar33._4_4_ * -auVar47._4_4_;
          auVar41._8_4_ = auVar33._8_4_ * -auVar47._8_4_;
          auVar41._12_4_ = auVar33._12_4_ * -auVar47._12_4_;
          auVar33 = vfmadd231ps_fma(auVar45,auVar56,*(undefined1 (*) [16])(uVar24 + 0x30));
          auVar38._0_4_ = auVar33._0_4_ * -auVar51._0_4_;
          auVar38._4_4_ = auVar33._4_4_ * -auVar51._4_4_;
          auVar38._8_4_ = auVar33._8_4_ * -auVar51._8_4_;
          auVar38._12_4_ = auVar33._12_4_ * -auVar51._12_4_;
          auVar31 = vfmadd231ps_fma(auVar31,auVar56,*(undefined1 (*) [16])(uVar24 + 0x40));
          auVar33._0_4_ = auVar31._0_4_ * -auVar34._0_4_;
          auVar33._4_4_ = auVar31._4_4_ * -auVar34._4_4_;
          auVar33._8_4_ = auVar31._8_4_ * -auVar34._8_4_;
          auVar33._12_4_ = auVar31._12_4_ * -auVar34._12_4_;
          auVar45._0_4_ = auVar47._0_4_ + auVar41._0_4_;
          auVar45._4_4_ = auVar47._4_4_ + auVar41._4_4_;
          auVar45._8_4_ = auVar47._8_4_ + auVar41._8_4_;
          auVar45._12_4_ = auVar47._12_4_ + auVar41._12_4_;
          auVar47._0_4_ = auVar51._0_4_ + auVar38._0_4_;
          auVar47._4_4_ = auVar51._4_4_ + auVar38._4_4_;
          auVar47._8_4_ = auVar51._8_4_ + auVar38._8_4_;
          auVar47._12_4_ = auVar51._12_4_ + auVar38._12_4_;
          auVar50._0_4_ = auVar34._0_4_ + auVar33._0_4_;
          auVar50._4_4_ = auVar34._4_4_ + auVar33._4_4_;
          auVar50._8_4_ = auVar34._8_4_ + auVar33._8_4_;
          auVar50._12_4_ = auVar34._12_4_ + auVar33._12_4_;
          auVar34 = vpminsd_avx(auVar38,auVar47);
          auVar31 = vpminsd_avx(auVar33,auVar50);
          auVar34 = vmaxps_avx(auVar34,auVar31);
          auVar51 = vpminsd_avx(auVar41,auVar45);
          auVar45 = vpmaxsd_avx(auVar41,auVar45);
          auVar31 = vpmaxsd_avx(auVar38,auVar47);
          auVar33 = vpmaxsd_avx(auVar33,auVar50);
          auVar33 = vminps_avx(auVar31,auVar33);
          auVar31 = vmaxps_avx(auVar49,auVar51);
          auVar34 = vmaxps_avx(auVar31,auVar34);
          auVar31 = vminps_avx(auVar30._0_16_,auVar45);
          auVar31 = vminps_avx(auVar31,auVar33);
          tNear.field_0._0_4_ = auVar34._0_4_ * 0.99999964;
          tNear.field_0._4_4_ = auVar34._4_4_ * 0.99999964;
          tNear.field_0._8_4_ = auVar34._8_4_ * 0.99999964;
          tNear.field_0._12_4_ = auVar34._12_4_ * 0.99999964;
          auVar34._0_4_ = auVar31._0_4_ * 1.0000004;
          auVar34._4_4_ = auVar31._4_4_ * 1.0000004;
          auVar34._8_4_ = auVar31._8_4_ * 1.0000004;
          auVar34._12_4_ = auVar31._12_4_ * 1.0000004;
          auVar34 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar34,2);
          uVar22 = vmovmskps_avx(auVar34);
          goto LAB_00603993;
        }
        bVar19 = false;
      }
      if (bVar19) {
        if (unaff_RBX == 0) {
          iVar21 = 4;
        }
        else {
          uVar25 = sVar26 & 0xfffffffffffffff0;
          lVar15 = 0;
          for (uVar24 = unaff_RBX; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          iVar21 = 0;
          uVar24 = unaff_RBX - 1 & unaff_RBX;
          sVar26 = *(ulong *)(uVar25 + lVar15 * 8);
          if (uVar24 != 0) {
            uVar7 = tNear.field_0.i[lVar15];
            lVar15 = 0;
            for (uVar16 = uVar24; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar16 = *(ulong *)(uVar25 + lVar15 * 8);
            uVar8 = tNear.field_0.i[lVar15];
            if (uVar24 == 0) {
              if (uVar7 < uVar8) {
                (pSVar29->ptr).ptr = uVar16;
                pSVar29->dist = uVar8;
                pSVar29 = pSVar29 + 1;
              }
              else {
                (pSVar29->ptr).ptr = sVar26;
                pSVar29->dist = uVar7;
                sVar26 = uVar16;
                pSVar29 = pSVar29 + 1;
              }
            }
            else {
              auVar35._8_8_ = 0;
              auVar35._0_8_ = sVar26;
              auVar34 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar7));
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar16;
              auVar31 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar8));
              lVar15 = 0;
              for (uVar16 = uVar24; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(uVar25 + lVar15 * 8);
              auVar45 = vpunpcklqdq_avx(auVar42,ZEXT416((uint)tNear.field_0.i[lVar15]));
              auVar33 = vpcmpgtd_avx(auVar31,auVar34);
              if (uVar24 == 0) {
                auVar51 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar31,auVar34,auVar51);
                auVar34 = vblendvps_avx(auVar34,auVar31,auVar51);
                auVar31 = vpcmpgtd_avx(auVar45,auVar33);
                auVar51 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar45,auVar33,auVar51);
                auVar33 = vblendvps_avx(auVar33,auVar45,auVar51);
                auVar45 = vpcmpgtd_avx(auVar33,auVar34);
                auVar45 = vpshufd_avx(auVar45,0xaa);
                SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar34,auVar45);
                SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar34,auVar33,auVar45);
                *pSVar29 = SVar10;
                pSVar29[1] = SVar9;
                sVar26 = auVar31._0_8_;
                pSVar29 = pSVar29 + 2;
              }
              else {
                lVar15 = 0;
                for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                  lVar15 = lVar15 + 1;
                }
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *(ulong *)(uVar25 + lVar15 * 8);
                auVar47 = vpunpcklqdq_avx(auVar48,ZEXT416((uint)tNear.field_0.i[lVar15]));
                auVar51 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar31,auVar34,auVar51);
                auVar34 = vblendvps_avx(auVar34,auVar31,auVar51);
                auVar31 = vpcmpgtd_avx(auVar47,auVar45);
                auVar51 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar47,auVar45,auVar51);
                auVar45 = vblendvps_avx(auVar45,auVar47,auVar51);
                auVar51 = vpcmpgtd_avx(auVar45,auVar34);
                auVar47 = vpshufd_avx(auVar51,0xaa);
                auVar51 = vblendvps_avx(auVar45,auVar34,auVar47);
                SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar34,auVar45,auVar47);
                auVar34 = vpcmpgtd_avx(auVar31,auVar33);
                auVar45 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar31,auVar33,auVar45);
                auVar31 = vblendvps_avx(auVar33,auVar31,auVar45);
                auVar33 = vpcmpgtd_avx(auVar51,auVar31);
                auVar33 = vpshufd_avx(auVar33,0xaa);
                SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar51,auVar31,auVar33);
                SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar31,auVar51,auVar33);
                *pSVar29 = SVar9;
                pSVar29[1] = SVar11;
                pSVar29[2] = SVar10;
                sVar26 = auVar34._0_8_;
                pSVar29 = pSVar29 + 3;
              }
            }
          }
        }
      }
      else {
        iVar21 = 6;
      }
    } while (iVar21 == 0);
    if (iVar21 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(sVar26 & 0xfffffffffffffff0) * 0x40 + 0x20))(pre,ray,k,context);
      uVar22 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30 = ZEXT1664(CONCAT412(uVar22,CONCAT48(uVar22,CONCAT44(uVar22,uVar22))));
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }